

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Merger.h
# Opt level: O0

bool __thiscall
PairedEnd::Merger<DNA>::FindBestOverlap
          (Merger<DNA> *this,Sequence<DNA> *seq1,Sequence<DNA> *seq2,OverlapInfo *overlap)

{
  size_t sVar1;
  int *piVar2;
  long lVar3;
  long lVar4;
  long lVar5;
  long lVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  double dVar10;
  double score;
  int local_58;
  int local_54;
  int length;
  int local_4c;
  int local_48;
  int pos2;
  int local_40;
  int local_3c;
  int pos1;
  int i;
  double bestScore;
  int len2;
  int len1;
  OverlapInfo *overlap_local;
  Sequence<DNA> *seq2_local;
  Sequence<DNA> *seq1_local;
  Merger<DNA> *this_local;
  
  _len2 = overlap;
  overlap_local = (OverlapInfo *)seq2;
  seq2_local = seq1;
  seq1_local = (Sequence<DNA> *)this;
  sVar1 = Sequence<DNA>::Length(seq1);
  bestScore._4_4_ = (int)sVar1;
  sVar1 = Sequence<DNA>::Length((Sequence<DNA> *)overlap_local);
  bestScore._0_4_ = (int)sVar1;
  _len2->length = 0;
  _len2->pos1 = 0;
  _len2->pos2 = 0;
  _pos1 = 2.2250738585072014e-308;
  for (local_3c = 0; local_3c <= bestScore._4_4_ + bestScore._0_4_; local_3c = local_3c + 1) {
    pos2 = bestScore._4_4_ - local_3c;
    local_48 = 0;
    piVar2 = std::max<int>(&pos2,&local_48);
    local_40 = *piVar2;
    length = local_3c - bestScore._4_4_;
    local_54 = 0;
    piVar2 = std::max<int>(&length,&local_54);
    local_4c = *piVar2;
    score._4_4_ = bestScore._0_4_ - local_4c;
    piVar2 = std::min<int>((int *)((long)&score + 4),&local_3c);
    local_58 = *piVar2;
    if (this->mMinOverlap <= local_58) {
      lVar3 = std::__cxx11::string::c_str();
      lVar7 = (long)local_40;
      lVar4 = std::__cxx11::string::c_str();
      lVar8 = (long)local_4c;
      lVar5 = std::__cxx11::string::c_str();
      lVar9 = (long)local_40;
      lVar6 = std::__cxx11::string::c_str();
      dVar10 = ComputeOverlapScore(this,(char *)(lVar3 + lVar7),(char *)(lVar4 + lVar8),
                                   (char *)(lVar5 + lVar9),(char *)(lVar6 + local_4c),(long)local_58
                                  );
      if (_pos1 < dVar10) {
        _len2->length = (long)local_58;
        _len2->pos1 = (long)local_40;
        _len2->pos2 = (long)local_4c;
        _pos1 = dVar10;
      }
    }
  }
  return 2.2250738585072014e-308 < _pos1;
}

Assistant:

bool Merger< A >::FindBestOverlap( const Sequence< A >& seq1,
                                   const Sequence< A >& seq2,
                                   OverlapInfo*         overlap ) const {
  int len1 = seq1.Length();
  int len2 = seq2.Length();

  overlap->length = 0;
  overlap->pos1   = 0;
  overlap->pos2   = 0;

  double bestScore = DBL_MIN;

  // Slide base by base, finding best overlap
  for( int i = 0; i <= len1 + len2; i++ ) {
    int pos1 = std::max( len1 - i, 0 );
    int pos2 = std::max( i - len1, 0 );

    int length = std::min( len2 - pos2, i );
    if( length < mMinOverlap )
      continue;

    double score = ComputeOverlapScore(
      seq1.sequence.c_str() + pos1, seq2.sequence.c_str() + pos2,
      seq1.quality.c_str() + pos1, seq2.quality.c_str() + pos2, length );

    if( score > bestScore ) {
      bestScore       = score;
      overlap->length = length;
      overlap->pos1   = pos1;
      overlap->pos2   = pos2;
    }
  }

  return ( bestScore > DBL_MIN );
}